

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_expanded_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  ostream *poVar1;
  allocator<char> local_2aa;
  allocator<char> local_2a9;
  string tmp;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream out;
  ostream local_198 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  App::get_display_name_abi_cxx11_(&tmp,sub);
  poVar1 = ::std::operator<<(local_198,(string *)&tmp);
  ::std::operator<<(poVar1,"\n");
  ::std::__cxx11::string::~string((string *)&tmp);
  (*(this->super_FormatterBase)._vptr_FormatterBase[9])(&tmp,this,sub);
  ::std::operator<<(local_198,(string *)&tmp);
  ::std::__cxx11::string::~string((string *)&tmp);
  (*(this->super_FormatterBase)._vptr_FormatterBase[4])(&tmp,this,sub);
  ::std::operator<<(local_198,(string *)&tmp);
  ::std::__cxx11::string::~string((string *)&tmp);
  make_groups_abi_cxx11_(&tmp,this,sub,Sub);
  ::std::operator<<(local_198,(string *)&tmp);
  ::std::__cxx11::string::~string((string *)&tmp);
  (*(this->super_FormatterBase)._vptr_FormatterBase[5])(&tmp,this,sub,2);
  ::std::operator<<(local_198,(string *)&tmp);
  ::std::__cxx11::string::~string((string *)&tmp);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"\n\n",(allocator<char> *)&local_288);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"\n",&local_2aa);
  detail::find_and_replace(&tmp,&local_1c8,&local_1e8,&local_208);
  ::std::__cxx11::string::~string((string *)&local_208);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::substr((ulong)&local_288,(ulong)&tmp);
  ::std::__cxx11::string::operator=((string *)&tmp,(string *)&local_288);
  ::std::__cxx11::string::~string((string *)&local_288);
  ::std::__cxx11::string::string((string *)&local_228,(string *)&tmp);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"\n",&local_2aa);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"\n  ",&local_2a9);
  detail::find_and_replace(&local_288,&local_228,&local_248,&local_268);
  ::std::operator+(__return_storage_ptr__,&local_288,"\n");
  ::std::__cxx11::string::~string((string *)&local_288);
  ::std::__cxx11::string::~string((string *)&local_268);
  ::std::__cxx11::string::~string((string *)&local_248);
  ::std::__cxx11::string::~string((string *)&local_228);
  ::std::__cxx11::string::~string((string *)&tmp);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_expanded(const App *sub) const {
    std::stringstream out;
    out << sub->get_display_name() << "\n";

    out << make_description(sub);
    out << make_positionals(sub);
    out << make_groups(sub, AppFormatMode::Sub);
    out << make_subcommands(sub, AppFormatMode::Sub);

    // Drop blank spaces
    std::string tmp = detail::find_and_replace(out.str(), "\n\n", "\n");
    tmp = tmp.substr(0, tmp.size() - 1);  // Remove the final '\n'

    // Indent all but the first line (the name)
    return detail::find_and_replace(tmp, "\n", "\n  ") + "\n";
}